

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.hpp
# Opt level: O1

path * __thiscall
libtest::unit_test<libtest::a_plus_b>::small_genfile_path_abi_cxx11_
          (path *__return_storage_ptr__,unit_test<libtest::a_plus_b> *this,usize index,bool in)

{
  ulong *puVar1;
  size_type *psVar2;
  bool bVar3;
  char cVar4;
  undefined8 *puVar5;
  unit_test<libtest::a_plus_b> *puVar6;
  char cVar7;
  ulong uVar8;
  ulong uVar9;
  string __str;
  ulong *local_120;
  long local_118;
  ulong local_110;
  undefined4 uStack_108;
  undefined4 uStack_104;
  ulong *local_100;
  uint local_f8;
  undefined4 uStack_f4;
  ulong local_f0 [2];
  string_type local_e0;
  ulong *local_c0;
  long local_b8;
  ulong local_b0 [2];
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  path local_80;
  path local_58;
  
  gen_case_dir_abi_cxx11_();
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"small_","");
  cVar7 = '\x01';
  if ((unit_test<libtest::a_plus_b> *)0x9 < this) {
    puVar6 = this;
    cVar4 = '\x04';
    do {
      cVar7 = cVar4;
      if (puVar6 < (unit_test<libtest::a_plus_b> *)0x64) {
        cVar7 = cVar7 + -2;
        goto LAB_001088cd;
      }
      if (puVar6 < (unit_test<libtest::a_plus_b> *)0x3e8) {
        cVar7 = cVar7 + -1;
        goto LAB_001088cd;
      }
      if (puVar6 < (unit_test<libtest::a_plus_b> *)0x2710) goto LAB_001088cd;
      bVar3 = (unit_test<libtest::a_plus_b> *)0x1869f < puVar6;
      puVar6 = (unit_test<libtest::a_plus_b> *)((ulong)puVar6 / 10000);
      cVar4 = cVar7 + '\x04';
    } while (bVar3);
    cVar7 = cVar7 + '\x01';
  }
LAB_001088cd:
  local_100 = local_f0;
  std::__cxx11::string::_M_construct((ulong)&local_100,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_100,local_f8,(unsigned_long)this);
  uVar9 = CONCAT44(uStack_f4,local_f8) + local_98;
  uVar8 = 0xf;
  if (local_a0 != local_90) {
    uVar8 = local_90[0];
  }
  if (uVar8 < uVar9) {
    uVar8 = 0xf;
    if (local_100 != local_f0) {
      uVar8 = local_f0[0];
    }
    if (uVar8 < uVar9) goto LAB_0010893c;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_a0);
  }
  else {
LAB_0010893c:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_100);
  }
  local_120 = &local_110;
  puVar1 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar1) {
    local_110 = *puVar1;
    uStack_108 = *(undefined4 *)(puVar5 + 3);
    uStack_104 = *(undefined4 *)((long)puVar5 + 0x1c);
  }
  else {
    local_110 = *puVar1;
    local_120 = (ulong *)*puVar5;
  }
  local_118 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_c0 = local_b0;
  if ((char)index == '\0') {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,".out","");
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,".in","");
  }
  uVar9 = 0xf;
  if (local_120 != &local_110) {
    uVar9 = local_110;
  }
  if (uVar9 < (ulong)(local_b8 + local_118)) {
    uVar9 = 0xf;
    if (local_c0 != local_b0) {
      uVar9 = local_b0[0];
    }
    if ((ulong)(local_b8 + local_118) <= uVar9) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_120);
      goto LAB_00108a44;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_c0);
LAB_00108a44:
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  psVar2 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_e0.field_2._M_allocated_capacity = *psVar2;
    local_e0.field_2._8_8_ = puVar5[3];
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar2;
    local_e0._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_e0._M_string_length = puVar5[1];
  *puVar5 = psVar2;
  puVar5[1] = 0;
  *(undefined1 *)psVar2 = 0;
  std::filesystem::__cxx11::path::path(&local_80,&local_e0,auto_format);
  std::filesystem::__cxx11::operator/(__return_storage_ptr__,&local_58,&local_80);
  std::filesystem::__cxx11::path::~path(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0,local_b0[0] + 1);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120,local_110 + 1);
  }
  if (local_100 != local_f0) {
    operator_delete(local_100,local_f0[0] + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_58);
  return __return_storage_ptr__;
}

Assistant:

static fs::path small_genfile_path(const usize index, const bool in) { return gen_case_dir() / (std::string("small_") + std::to_string(index) + (in ? std::string(".in") : std::string(".out"))); }